

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O0

void __thiscall Assembler::Assembler(Assembler *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_518;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_4ba;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_4b9;
  int local_4b8 [26];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_450;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_448;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_420;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_3f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_3d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_3a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_380;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_358;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_308;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_2e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_290;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_240;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_60;
  iterator local_38;
  size_type local_30;
  allocator<char> local_11;
  Assembler *local_10;
  Assembler *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->outputFileName,"out.o",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::vector<char,_std::allocator<char>_>::vector(&this->bytes);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
  ::map(&this->symbolTable);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>_>_>
  ::map(&this->relocationTable);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::map(&this->codeBySection);
  local_450 = &local_448;
  local_4b8[0x19] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(local_450,(char (*) [5])"halt",local_4b8 + 0x19);
  local_450 = &local_420;
  local_4b8[0x18] = 0x20;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(local_450,(char (*) [5])"iret",local_4b8 + 0x18);
  local_450 = &local_3f8;
  local_4b8[0x17] = 0x40;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])0x1483b2,local_4b8 + 0x17);
  local_450 = &local_3d0;
  local_4b8[0x16] = 0x10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])0x148b35,local_4b8 + 0x16);
  local_450 = &local_3a8;
  local_4b8[0x15] = 0x30;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(local_450,(char (*) [5])"call",local_4b8 + 0x15);
  local_450 = &local_380;
  local_4b8[0x14] = 0x50;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"jmp",local_4b8 + 0x14);
  local_450 = &local_358;
  local_4b8[0x13] = 0x51;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"jeq",local_4b8 + 0x13);
  local_450 = &local_330;
  local_4b8[0x12] = 0x52;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"jne",local_4b8 + 0x12);
  local_450 = &local_308;
  local_4b8[0x11] = 0x53;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"jgt",local_4b8 + 0x11);
  local_450 = &local_2e0;
  local_4b8[0x10] = 0xa0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"ldr",local_4b8 + 0x10);
  local_450 = &local_2b8;
  local_4b8[0xf] = 0x91;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"shr",local_4b8 + 0xf);
  local_450 = &local_290;
  local_4b8[0xe] = 0xb0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"str",local_4b8 + 0xe);
  local_450 = &local_268;
  local_4b8[0xd] = 0xb0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(local_450,(char (*) [5])"push",local_4b8 + 0xd);
  local_450 = &local_240;
  local_4b8[0xc] = 0xa0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"pop",local_4b8 + 0xc);
  local_450 = &local_218;
  local_4b8[0xb] = 0x60;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(local_450,(char (*) [5])"xchg",local_4b8 + 0xb);
  local_450 = &local_1f0;
  local_4b8[10] = 0x70;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"add",local_4b8 + 10);
  local_450 = &local_1c8;
  local_4b8[9] = 0x71;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"sub",local_4b8 + 9);
  local_450 = &local_1a0;
  local_4b8[8] = 0x72;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"mul",local_4b8 + 8);
  local_450 = &local_178;
  local_4b8[7] = 0x73;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"div",local_4b8 + 7);
  local_450 = &local_150;
  local_4b8[6] = 0x74;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"cmp",local_4b8 + 6);
  local_450 = &local_128;
  local_4b8[5] = 0x80;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"not",local_4b8 + 5);
  local_450 = &local_100;
  local_4b8[4] = 0x81;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])0x148d2b,local_4b8 + 4);
  local_450 = &local_d8;
  local_4b8[3] = 0x82;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[3],_int,_true>(local_450,(char (*) [3])0x148401,local_4b8 + 3);
  local_450 = &local_b0;
  local_4b8[2] = 0x83;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"xor",local_4b8 + 2);
  local_450 = &local_88;
  local_4b8[1] = 0x84;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(local_450,(char (*) [5])"test",local_4b8 + 1);
  local_450 = &local_60;
  local_4b8[0] = 0x90;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[4],_int,_true>(local_450,(char (*) [4])"shl",local_4b8);
  local_38 = &local_448;
  local_30 = 0x1a;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::allocator(&local_4ba);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->instrDescription,__l,&local_4b9,&local_4ba);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~allocator(&local_4ba);
  local_518 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *)&local_38;
  do {
    local_518 = local_518 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(local_518);
  } while (local_518 != &local_448);
  this->isLabelWithoutCode = false;
  return;
}

Assistant:

Assembler() {
        isLabelWithoutCode = false;
    }